

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_space_time_stack.cpp
# Opt level: O1

void __thiscall
KokkosTools::SpaceTimeStack::StackNode::print_recursive
          (StackNode *this,ostream *os,string *my_indent,string *child_indent,double tree_time)

{
  long lVar1;
  long lVar2;
  pointer pcVar3;
  StackNode *this_00;
  ostream *poVar4;
  _Rb_tree_node_base *p_Var5;
  _Base_ptr p_Var6;
  long lVar7;
  char *pcVar8;
  _Rb_tree_header *p_Var9;
  double dVar10;
  double dVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string grandchild_indent;
  set<const_KokkosTools::SpaceTimeStack::StackNode_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_kokkos[P]kokkos_tools_profiling_space_time_stack_kp_space_time_stack_cpp:376:20),_std::allocator<const_KokkosTools::SpaceTimeStack::StackNode_*>_>
  children_by_time;
  long *local_e0 [2];
  long local_d0 [2];
  double local_c0;
  string local_b8;
  double local_98;
  double local_90;
  string local_88;
  double local_68;
  _Rb_tree<const_KokkosTools::SpaceTimeStack::StackNode_*,_const_KokkosTools::SpaceTimeStack::StackNode_*,_std::_Identity<const_KokkosTools::SpaceTimeStack::StackNode_*>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_kokkos[P]kokkos_tools_profiling_space_time_stack_kp_space_time_stack_cpp:376:20),_std::allocator<const_KokkosTools::SpaceTimeStack::StackNode_*>_>
  local_60;
  
  dVar10 = (this->total_runtime / tree_time) * 100.0;
  if (dVar10 < output_threshold) {
    return;
  }
  local_68 = tree_time;
  if ((this->name)._M_string_length == 0) goto LAB_0012b561;
  local_90 = dVar10;
  std::__ostream_insert<char,std::char_traits<char>>
            (os,(my_indent->_M_dataplus)._M_p,my_indent->_M_string_length);
  dVar10 = this->avg_runtime;
  dVar11 = (this->max_runtime / dVar10 + -1.0) * 100.0;
  lVar7 = *(long *)os;
  lVar1 = *(long *)(lVar7 + -0x18);
  *(uint *)(os + lVar1 + 0x18) = *(uint *)(os + lVar1 + 0x18) & 0xfffffefb | 0x100;
  *(undefined8 *)(os + *(long *)(lVar7 + -0x18) + 8) = 2;
  poVar4 = std::ostream::_M_insert<double>(dVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," sec ",5);
  lVar7 = *(long *)os;
  lVar1 = *(long *)(lVar7 + -0x18);
  *(uint *)(os + lVar1 + 0x18) = *(uint *)(os + lVar1 + 0x18) & 0xfffffefb | 4;
  *(undefined8 *)(os + *(long *)(lVar7 + -0x18) + 8) = 1;
  local_98 = (this->total_kokkos_runtime / this->total_runtime) * 100.0;
  if (this->kind == STACK_REGION) {
    dVar10 = 0.0;
    local_c0 = this->total_runtime;
    for (p_Var5 = (this->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != &(this->children)._M_t._M_impl.super__Rb_tree_header;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      dVar10 = dVar10 + *(double *)(p_Var5 + 4);
    }
    local_c0 = (1.0 - dVar10 / local_c0) * 100.0;
    lVar7 = this->total_number_of_kernel_calls;
    dVar10 = this->avg_runtime;
    poVar4 = std::ostream::_M_insert<double>(local_90);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"% ",2);
    poVar4 = std::ostream::_M_insert<double>(local_98);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"% ",2);
    poVar4 = std::ostream::_M_insert<double>(dVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"% ",2);
    poVar4 = std::ostream::_M_insert<double>(local_c0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"% ",2);
    lVar1 = *(long *)poVar4;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xfffffefb | 0x100;
    *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 8) = 2;
    poVar4 = std::ostream::_M_insert<double>((double)lVar7 / dVar10);
    pcVar8 = " ";
    lVar7 = 1;
  }
  else {
    poVar4 = std::ostream::_M_insert<double>(local_90);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"% ",2);
    poVar4 = std::ostream::_M_insert<double>(local_98);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"% ",2);
    poVar4 = std::ostream::_M_insert<double>(dVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"% ",2);
    pcVar8 = "------ ";
    lVar7 = 7;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar8,lVar7);
  poVar4 = std::ostream::_M_insert<long>((long)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,(this->name)._M_dataplus._M_p,(this->name)._M_string_length);
  switch(this->kind) {
  case STACK_FOR:
    pcVar8 = " [for]";
    lVar7 = 6;
    goto LAB_0012b541;
  case STACK_REDUCE:
    pcVar8 = " [reduce]";
    break;
  case STACK_SCAN:
    pcVar8 = " [scan]";
    goto LAB_0012b525;
  case STACK_REGION:
    pcVar8 = " [region]";
    break;
  case STACK_COPY:
    pcVar8 = " [copy]";
LAB_0012b525:
    lVar7 = 7;
    goto LAB_0012b541;
  default:
    goto switchD_0012b505_default;
  }
  lVar7 = 9;
LAB_0012b541:
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar8,lVar7);
switchD_0012b505_default:
  local_60._M_impl._0_1_ =
       (_Rb_tree<KokkosTools::SpaceTimeStack::StackNode_const*,KokkosTools::SpaceTimeStack::StackNode_const*,std::_Identity<KokkosTools::SpaceTimeStack::StackNode_const*>,KokkosTools::SpaceTimeStack::StackNode::print_recursive(std::ostream&,std::__cxx11::string,std::__cxx11::string_const&,double)const::_lambda(KokkosTools::SpaceTimeStack::StackNode_const*,KokkosTools::SpaceTimeStack::StackNode_const*)_1_,std::allocator<KokkosTools::SpaceTimeStack::StackNode_const*>>
        )0xa;
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_60,1);
LAB_0012b561:
  if ((this->children)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    p_Var6 = (this->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var9 = &(this->children)._M_t._M_impl.super__Rb_tree_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)p_Var6 != p_Var9) {
      do {
        local_b8._M_dataplus._M_p = (pointer)(p_Var6 + 1);
        std::
        _Rb_tree<KokkosTools::SpaceTimeStack::StackNode_const*,KokkosTools::SpaceTimeStack::StackNode_const*,std::_Identity<KokkosTools::SpaceTimeStack::StackNode_const*>,KokkosTools::SpaceTimeStack::StackNode::print_recursive(std::ostream&,std::__cxx11::string,std::__cxx11::string_const&,double)const::{lambda(KokkosTools::SpaceTimeStack::StackNode_const*,KokkosTools::SpaceTimeStack::StackNode_const*)#1},std::allocator<KokkosTools::SpaceTimeStack::StackNode_const*>>
        ::_M_insert_unique<KokkosTools::SpaceTimeStack::StackNode_const*>
                  ((_Rb_tree<KokkosTools::SpaceTimeStack::StackNode_const*,KokkosTools::SpaceTimeStack::StackNode_const*,std::_Identity<KokkosTools::SpaceTimeStack::StackNode_const*>,KokkosTools::SpaceTimeStack::StackNode::print_recursive(std::ostream&,std::__cxx11::string,std::__cxx11::string_const&,double)const::_lambda(KokkosTools::SpaceTimeStack::StackNode_const*,KokkosTools::SpaceTimeStack::StackNode_const*)_1_,std::allocator<KokkosTools::SpaceTimeStack::StackNode_const*>>
                    *)&local_60,(StackNode **)&local_b8);
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      } while ((_Rb_tree_header *)p_Var6 != p_Var9);
    }
    p_Var9 = &local_60._M_impl.super__Rb_tree_header;
    p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(&p_Var9->_M_header);
    if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left != p_Var9) {
      p_Var6 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        local_b8._M_string_length = 0;
        local_b8.field_2._M_local_buf[0] = '\0';
        if (p_Var6 == p_Var5) {
          local_e0[0] = local_d0;
          pcVar3 = (child_indent->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_e0,pcVar3,pcVar3 + child_indent->_M_string_length);
          std::__cxx11::string::append((char *)local_e0);
        }
        else {
          local_e0[0] = local_d0;
          pcVar3 = (child_indent->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_e0,pcVar3,pcVar3 + child_indent->_M_string_length);
          std::__cxx11::string::append((char *)local_e0);
        }
        std::__cxx11::string::operator=((string *)&local_b8,(string *)local_e0);
        if (local_e0[0] != local_d0) {
          operator_delete(local_e0[0],local_d0[0] + 1);
        }
        this_00 = *(StackNode **)(p_Var6 + 1);
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        pcVar3 = (child_indent->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_88,pcVar3,pcVar3 + child_indent->_M_string_length);
        std::__cxx11::string::append((char *)&local_88);
        print_recursive(this_00,os,&local_88,&local_b8,local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,
                          CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                                   local_b8.field_2._M_local_buf[0]) + 1);
        }
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      } while ((_Rb_tree_header *)p_Var6 != &local_60._M_impl.super__Rb_tree_header);
    }
    std::
    _Rb_tree<const_KokkosTools::SpaceTimeStack::StackNode_*,_const_KokkosTools::SpaceTimeStack::StackNode_*,_std::_Identity<const_KokkosTools::SpaceTimeStack::StackNode_*>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/space-time-stack/kp_space_time_stack.cpp:376:20),_std::allocator<const_KokkosTools::SpaceTimeStack::StackNode_*>_>
    ::~_Rb_tree(&local_60);
  }
  return;
}

Assistant:

void print_recursive(std::ostream& os, std::string my_indent,
                       std::string const& child_indent,
                       double tree_time) const {
    auto percent = (total_runtime / tree_time) * 100.0;

    if (percent < output_threshold) return;
    if (!name.empty()) {
      os << my_indent;
      auto imbalance = (max_runtime / avg_runtime - 1.0) * 100.0;
      os << std::scientific << std::setprecision(2);
      os << avg_runtime << " sec ";
      os << std::fixed << std::setprecision(1);
      auto percent_kokkos = (total_kokkos_runtime / total_runtime) * 100.0;

      // Sum over kids if we're a region
      if (kind == STACK_REGION) {
        double child_runtime = 0.0;
        for (auto& child : children) {
          child_runtime += child.total_runtime;
        }
        auto remainder = (1.0 - child_runtime / total_runtime) * 100.0;
        double kps     = total_number_of_kernel_calls / avg_runtime;
        os << percent << "% " << percent_kokkos << "% " << imbalance << "% "
           << remainder << "% " << std::scientific << std::setprecision(2)
           << kps << " " << number_of_calls << " " << name;
      } else
        os << percent << "% " << percent_kokkos << "% " << imbalance << "% "
           << "------ " << number_of_calls << " " << name;

      switch (kind) {
        case STACK_FOR: os << " [for]"; break;
        case STACK_REDUCE: os << " [reduce]"; break;
        case STACK_SCAN: os << " [scan]"; break;
        case STACK_REGION: os << " [region]"; break;
        case STACK_COPY: os << " [copy]"; break;
      };

      os << '\n';
    }
    if (children.empty()) return;
    auto by_time = [](StackNode const* a, StackNode const* b) {
      if (a->total_runtime != b->total_runtime) {
        return a->total_runtime > b->total_runtime;
      }
      return a->name < b->name;
    };
    std::set<StackNode const*, decltype(by_time)> children_by_time(by_time);
    for (auto& child : children) {
      children_by_time.insert(&child);
    }
    auto last = children_by_time.end();
    --last;
    for (auto it = children_by_time.begin(); it != children_by_time.end();
         ++it) {
      std::string grandchild_indent;
      if (it == last) {
        grandchild_indent = child_indent + "    ";
      } else {
        grandchild_indent = child_indent + "|   ";
      }
      auto child = *it;
      child->print_recursive(os, child_indent + "|-> ", grandchild_indent,
                             tree_time);
    }
  }